

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O2

UnlocalizedNumberFormatter * __thiscall
icu_63::number::NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>::adoptUnit
          (UnlocalizedNumberFormatter *__return_storage_ptr__,
          NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter> *this,
          MeasureUnit *unit)

{
  impl::MacroProps::MacroProps((MacroProps *)__return_storage_ptr__,&this->fMacros);
  if (unit != (MeasureUnit *)0x0) {
    MeasureUnit::operator=
              (&(__return_storage_ptr__->
                super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
                unit,unit);
    (*(unit->super_UObject)._vptr_UObject[1])(unit);
  }
  return __return_storage_ptr__;
}

Assistant:

Derived NumberFormatterSettings<Derived>::adoptUnit(icu::MeasureUnit* unit) const& {
    Derived copy(*this);
    // Just move the unit into the MacroProps by value, and delete it since we have ownership.
    // NOTE: Slicing occurs here. However, CurrencyUnit can be restored from MeasureUnit.
    // TimeUnit may be affected, but TimeUnit is not as relevant to number formatting.
    if (unit != nullptr) {
        // TODO: On nullptr, reset to default value?
        copy.fMacros.unit = std::move(*unit);
        delete unit;
    }
    return copy;
}